

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * Kvm::readCharProc(Kvm *vm,Value *args)

{
  undefined8 in_RAX;
  Value *pVVar1;
  istream *piVar2;
  char c;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  if (vm->NIL == args) {
    piVar2 = (istream *)&std::cin;
  }
  else {
    piVar2 = (istream *)args[1]._vptr_Value;
  }
  std::operator>>(piVar2,&local_11);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    pVVar1 = vm->EOFOBJ;
  }
  else {
    pVVar1 = (Value *)((long)local_11 * 4 + 2);
  }
  return pVVar1;
}

Assistant:

const Value* Kvm::readCharProc(Kvm *vm, const Value *args)
{
    const InputPort *ip = static_cast<const InputPort *>(args);
    std::istream &stream = args == vm->NIL ? std::cin : *ip->input;

    char c;
    stream >> c;
    return stream ? vm->EOFOBJ : vm->makeChar(c);
}